

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

UBool icu_63::ICU_Utility::parseChar(UnicodeString *id,int32_t *pos,UChar ch)

{
  short sVar1;
  uint uVar2;
  uint uVar3;
  UChar UVar4;
  char16_t *pcVar5;
  int iVar6;
  bool bVar7;
  
  iVar6 = *pos;
  skipWhitespace(id,pos,'\x01');
  uVar2 = *pos;
  sVar1 = (id->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    uVar3 = (id->fUnion).fFields.fLength;
  }
  else {
    uVar3 = (int)sVar1 >> 5;
  }
  if (uVar2 == uVar3) {
    bVar7 = false;
  }
  else {
    UVar4 = L'\xffff';
    if (uVar2 < uVar3) {
      if (((int)sVar1 & 2U) == 0) {
        pcVar5 = (id->fUnion).fFields.fArray;
      }
      else {
        pcVar5 = (char16_t *)((long)&id->fUnion + 2);
      }
      UVar4 = pcVar5[(int)uVar2];
    }
    bVar7 = UVar4 == ch;
    if (bVar7) {
      iVar6 = uVar2 + 1;
    }
  }
  *pos = iVar6;
  return bVar7;
}

Assistant:

UBool ICU_Utility::parseChar(const UnicodeString& id, int32_t& pos, UChar ch) {
    int32_t start = pos;
    skipWhitespace(id, pos, TRUE);
    if (pos == id.length() ||
        id.charAt(pos) != ch) {
        pos = start;
        return FALSE;
    }
    ++pos;
    return TRUE;
}